

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O3

void __thiscall
slang::analysis::DataFlowAnalysis::DataFlowAnalysis
          (DataFlowAnalysis *this,AnalysisContext *context,Symbol *symbol,bool reportDiags)

{
  undefined7 in_register_00000009;
  Diagnostics *diagnostics;
  
  diagnostics = &context->diagnostics;
  if ((int)CONCAT71(in_register_00000009,reportDiags) == 0) {
    diagnostics = (Diagnostics *)0x0;
  }
  FlowAnalysisBase::FlowAnalysisBase
            ((FlowAnalysisBase *)this,symbol,((context->manager).ptr)->options,diagnostics);
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  state.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_
       = (pointer)(this->
                  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                  ).state.assigned.
                  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                  firstElement;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  state.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len =
       0;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  state.assigned.super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.cap =
       2;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  state.reachable = true;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  stateWhenTrue.assigned.
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ =
       (pointer)(this->
                super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                ).stateWhenTrue.assigned.
                super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                firstElement;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  stateWhenTrue.assigned.
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len = 0;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  stateWhenTrue.assigned.
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.cap = 2;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  stateWhenTrue.reachable = true;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  stateWhenFalse.assigned.
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ =
       (pointer)(this->
                super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                ).stateWhenFalse.assigned.
                super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                firstElement;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  stateWhenFalse.assigned.
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len = 0;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  stateWhenFalse.assigned.
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.cap = 2;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  stateWhenFalse.reachable = true;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  isStateSplit = false;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  inCondition = false;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  breakStates.super_SmallVectorBase<slang::analysis::DataFlowState>.data_ =
       (pointer)(this->
                super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                ).breakStates.super_SmallVectorBase<slang::analysis::DataFlowState>.firstElement;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  breakStates.super_SmallVectorBase<slang::analysis::DataFlowState>.len = 0;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  breakStates.super_SmallVectorBase<slang::analysis::DataFlowState>.cap = 2;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  returnStates.super_SmallVectorBase<slang::analysis::DataFlowState>.data_ =
       (pointer)(this->
                super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                ).returnStates.super_SmallVectorBase<slang::analysis::DataFlowState>.firstElement;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  returnStates.super_SmallVectorBase<slang::analysis::DataFlowState>.len = 0;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  returnStates.super_SmallVectorBase<slang::analysis::DataFlowState>.cap = 2;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
  .size_ctrl.ml = 0;
  (this->
  super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>).
  disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
  .size_ctrl.size = 0;
  this->context = context;
  (this->bitMapAllocator).alloc = &context->alloc;
  (this->bitMapAllocator).freeList = (FreeNode *)0x0;
  (this->lspMapAllocator).alloc = &context->alloc;
  (this->lspMapAllocator).freeList = (FreeNode *)0x0;
  (this->symbolToSlot).super_Storage.ptr = (char *)&this->symbolToSlot;
  *(SmallMap<const_slang::ast::ValueSymbol_*,_unsigned_int,_4UL,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
    **)&(this->symbolToSlot).super_Storage.field_0x48 = &this->symbolToSlot;
  *(undefined8 *)&(this->symbolToSlot).field_0x50 = 0x3f;
  *(undefined8 *)&(this->symbolToSlot).field_0x58 = 1;
  *(undefined8 *)&(this->symbolToSlot).field_0x60 = 0;
  *(undefined8 *)&(this->symbolToSlot).field_0x68 = 0;
  *(undefined1 **)&(this->symbolToSlot).field_0x60 =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  *(undefined8 *)&(this->symbolToSlot).field_0x70 = 0;
  *(undefined8 *)&(this->symbolToSlot).field_0x78 = 0;
  (this->lvalues).super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.data_ =
       (pointer)(this->lvalues).
                super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.firstElement;
  (this->lvalues).super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.len = 0;
  (this->lvalues).super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.cap = 2;
  (this->rvalues).super_Storage.ptr = (char *)&this->rvalues;
  *(SmallMap<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_4UL,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
    **)&(this->rvalues).super_Storage.field_0x128 = &this->rvalues;
  *(undefined8 *)&(this->rvalues).field_0x130 = 0x3f;
  *(undefined8 *)&(this->rvalues).field_0x138 = 1;
  *(undefined8 *)&(this->rvalues).field_0x140 = 0;
  *(undefined8 *)&(this->rvalues).field_0x148 = 0;
  *(undefined1 **)&(this->rvalues).field_0x140 =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  *(undefined8 *)&(this->rvalues).field_0x150 = 0;
  *(undefined8 *)&(this->rvalues).field_0x158 = 0;
  (this->lspVisitor).owner = this;
  (this->lspVisitor).currentLSP = (Expression *)0x0;
  this->isLValue = false;
  (this->timedStatements).super_SmallVectorBase<const_slang::ast::Statement_*>.data_ =
       (pointer)(this->timedStatements).super_SmallVectorBase<const_slang::ast::Statement_*>.
                firstElement;
  (this->timedStatements).super_SmallVectorBase<const_slang::ast::Statement_*>.len = 0;
  (this->timedStatements).super_SmallVectorBase<const_slang::ast::Statement_*>.cap = 5;
  (this->concurrentAssertions).
  super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
  .data_ = (pointer)(this->concurrentAssertions).
                    super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
                    .firstElement;
  (this->concurrentAssertions).
  super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
  .len = 0;
  (this->concurrentAssertions).
  super_SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
  .cap = 2;
  (this->sampledValueCalls).super_SmallVectorBase<const_slang::ast::CallExpression_*>.data_ =
       (pointer)(this->sampledValueCalls).super_SmallVectorBase<const_slang::ast::CallExpression_*>.
                firstElement;
  (this->sampledValueCalls).super_SmallVectorBase<const_slang::ast::CallExpression_*>.len = 0;
  (this->sampledValueCalls).super_SmallVectorBase<const_slang::ast::CallExpression_*>.cap = 5;
  return;
}

Assistant:

DataFlowAnalysis::DataFlowAnalysis(AnalysisContext& context, const Symbol& symbol,
                                   bool reportDiags) :
    AbstractFlowAnalysis(symbol, context.manager->getOptions(),
                         reportDiags ? &context.diagnostics : nullptr),
    context(context), bitMapAllocator(context.alloc), lspMapAllocator(context.alloc),
    lspVisitor(*this) {
}